

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

Am_Object am_gen_one_script_line(Am_Object *cmd)

{
  Am_Slot_Key key;
  bool bVar1;
  ostrstream oVar2;
  char cVar3;
  bool bVar4;
  Am_Value *pAVar5;
  Am_Wrapper *pAVar6;
  Am_Object *pAVar7;
  ostream *poVar8;
  Am_Value *in_RSI;
  char local_611;
  Am_Value v;
  Am_Object local_600;
  Am_Object local_5f8;
  Am_Object local_5f0;
  Am_Object local_5e8;
  Am_Value new_value;
  Am_Value object_modified_value;
  Am_Value cnt;
  Am_Object local_5b0;
  Am_Object local_5a8;
  Am_Value_List part_chain;
  ostrstream oss2;
  char line [300];
  ostrstream oss3;
  ostrstream oss;
  
  pAVar5 = Am_Object::Get((Am_Object *)in_RSI,Am_COMMAND_INDEX_IN_SCRIPT,1);
  Am_Value::Am_Value(&cnt,pAVar5);
  std::ostrstream::ostrstream(&oss,line,300,_S_out);
  reset_ostrstream(&oss);
  Am_Object::Create((Am_Object *)&oss2,(char *)&Am_Script_Line_Group);
  pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)in_RSI);
  pAVar7 = Am_Object::Add((Am_Object *)&oss2,0xc5,pAVar6,0);
  Am_Object::Am_Object(cmd,pAVar7);
  Am_Object::~Am_Object((Am_Object *)&oss2);
  v.type = 0;
  v.value.wrapper_value = (Am_Wrapper *)0x0;
  object_modified_value.type = 0;
  object_modified_value.value.wrapper_value = (Am_Wrapper *)0x0;
  new_value.type = 0;
  new_value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar5 = Am_Object::Get((Am_Object *)in_RSI,0x175,1);
  Am_Value::operator=(&v,pAVar5);
  bVar1 = Am_Value::Valid(&v);
  if (!bVar1) {
    pAVar5 = Am_Object::Get((Am_Object *)in_RSI,0x151,1);
    Am_Value::operator=(&v,pAVar5);
    bVar1 = Am_Value::Valid(&v);
    if (!bVar1) {
      pAVar5 = Am_Object::Get((Am_Object *)in_RSI,0x150,1);
      Am_Value::operator=(&v,pAVar5);
    }
  }
  bVar1 = Am_Value::Valid(&cnt);
  if (bVar1) {
    poVar8 = operator<<((ostream *)&oss,&cnt);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,". ",2);
  }
  poVar8 = operator<<((ostream *)&oss,&v);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  std::ostream::put((char)poVar8);
  Am_Object::Create((Am_Object *)&oss2,(char *)&Am_Script_Line_Command);
  pAVar7 = Am_Object::Set((Am_Object *)&oss2,0xab,line,0);
  pAVar7 = Am_Object::Add(pAVar7,0x169,&v,0);
  key = Am_TOP_SCRIPT_LINE_GROUP;
  pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(cmd);
  pAVar7 = Am_Object::Add(pAVar7,key,pAVar6,0);
  pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)in_RSI);
  pAVar7 = Am_Object::Add(pAVar7,0xc5,pAVar6,0);
  pAVar7 = Am_Object::Add(pAVar7,0xb8,0x175,0);
  Am_Object::Am_Object(&local_5e8,pAVar7);
  Am_Object::Add_Part(cmd,&local_5e8,true,0);
  Am_Object::~Am_Object(&local_5e8);
  Am_Object::~Am_Object((Am_Object *)&oss2);
  Am_Value_List::Am_Value_List(&part_chain);
  std::ostrstream::ostrstream(&oss2,line,300,_S_out);
  reset_ostrstream(&oss2);
  pAVar5 = Am_Object::Get((Am_Object *)in_RSI,0x16d,1);
  Am_Value::operator=(&object_modified_value,pAVar5);
  bVar1 = Am_Value::Valid(&object_modified_value);
  if (bVar1) {
    oVar2 = (ostrstream)find_placeholder_char((Am_Object *)in_RSI,0x16d);
    if (oVar2 != (ostrstream)0x0) {
      oss3 = oVar2;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss2,(char *)&oss3,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
    }
    gen_script_list_or_value
              ((char *)&local_5a8,(ostrstream *)line,(Am_Object *)&oss2,&Am_Script_Line_Modified,cmd
               ,in_RSI,SUB81(&object_modified_value,0),(Am_Object *)0x0,(Am_Value_List *)cmd);
    Am_Object::~Am_Object(&local_5a8);
  }
  Am_Object::Am_Object(&local_5f0,&Am_Object_Create_Command);
  bVar1 = Am_Object::Is_Instance_Of((Am_Object *)in_RSI,&local_5f0);
  Am_Object::~Am_Object(&local_5f0);
  if (!bVar1) {
    pAVar5 = Am_Object::Get((Am_Object *)in_RSI,0x169,1);
    Am_Value::operator=(&new_value,pAVar5);
    bVar1 = Am_Value::Exists(&new_value);
    if ((bVar1) &&
       ((bVar1 = Am_Value::Valid(&object_modified_value), !bVar1 || new_value.type != 0xa001 ||
        (bVar1 = Am_Value::operator!=(&new_value,&object_modified_value), bVar1)))) {
      std::ostrstream::ostrstream(&oss3,line,300,_S_out);
      reset_ostrstream(&oss3);
      cVar3 = find_placeholder_char((Am_Object *)in_RSI,0x169);
      if (cVar3 != '\0') {
        local_611 = cVar3;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss3,&local_611,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss3," = ",3);
      Am_Value_List::Make_Empty(&part_chain);
      gen_script_list_or_value
                ((char *)&local_5b0,(ostrstream *)line,(Am_Object *)&oss3,&Am_Script_Line_Value,cmd,
                 in_RSI,SUB81(&new_value,0),(Am_Object *)0x0,(Am_Value_List *)cmd);
      Am_Object::~Am_Object(&local_5b0);
      std::ostrstream::~ostrstream(&oss3);
    }
  }
  Am_Object::Am_Object(&local_5f8,&Am_Object_Create_Command);
  bVar4 = Am_Object::Is_Instance_Of((Am_Object *)in_RSI,&local_5f8);
  bVar1 = true;
  if (!bVar4) {
    Am_Object::Am_Object(&local_600,&Am_Find_Command);
    bVar1 = Am_Object::Is_Instance_Of((Am_Object *)in_RSI,&local_600);
    Am_Object::~Am_Object(&local_600);
  }
  Am_Object::~Am_Object(&local_5f8);
  if (bVar1 != false) {
    gen_create_parameters_line((Am_Object *)in_RSI,line,cmd);
  }
  std::ostrstream::~ostrstream(&oss2);
  Am_Value_List::~Am_Value_List(&part_chain);
  Am_Value::~Am_Value(&new_value);
  Am_Value::~Am_Value(&object_modified_value);
  Am_Value::~Am_Value(&v);
  std::ostrstream::~ostrstream(&oss);
  Am_Value::~Am_Value(&cnt);
  return (Am_Object)(Am_Object_Data *)cmd;
}

Assistant:

Am_Object
am_gen_one_script_line(Am_Object &cmd)
{
  Am_Value cnt = cmd.Peek(Am_COMMAND_INDEX_IN_SCRIPT);
  char line[300];
  OSTRSTREAM_CONSTR(oss, line, 300, std::ios::out);
  reset_ostrstream(oss); // go to the beginning
  Am_Object group = Am_Script_Line_Group.Create().Add(Am_COMMAND, cmd);
  Am_Value v, object_modified_value, new_value;
  v = cmd.Peek(Am_REGISTER_COMMAND);
  //if v.valid(), then there is a placeholder for the command itself
  // This only happens for match_commands
  if (!v.Valid()) {
    v = cmd.Peek(Am_SHORT_LABEL);
    if (!v.Valid())
      v = cmd.Peek(Am_LABEL);
  }
  if (cnt.Valid())
    oss << cnt << ". ";
  oss << v << " " << std::ends;
  OSTRSTREAM_COPY(oss, line, 300);
  group.Add_Part(Am_Script_Line_Command.Create()
                     .Set(Am_TEXT, line)
                     .Add(Am_VALUE, v)
                     .Add(Am_TOP_SCRIPT_LINE_GROUP, group)
                     .Add(Am_COMMAND, cmd)
                     .Add(Am_SLOTS_TO_SAVE, Am_REGISTER_COMMAND));

  Am_Value_List part_chain;
  OSTRSTREAM_CONSTR(oss2, line, 300, std::ios::out);
  reset_ostrstream(oss2); // go to the beginning
  object_modified_value = cmd.Peek(Am_OBJECT_MODIFIED);
  char placeholder_char;
  if (object_modified_value.Valid()) {
    placeholder_char = find_placeholder_char(cmd, Am_OBJECT_MODIFIED);
    if (placeholder_char)
      oss2 << placeholder_char << ": ";
    gen_script_list_or_value(line, oss2, Am_Script_Line_Modified, group, cmd,
                             object_modified_value, false, group, part_chain);
  }

  if (!cmd.Is_Instance_Of(Am_Object_Create_Command)) {
    new_value = cmd.Peek(Am_VALUE);
    if (new_value.Exists() &&
        (!object_modified_value.Valid() || new_value.type != Am_OBJECT ||
         new_value != object_modified_value)) {
      //don't output new_value if same as object_modified (as in create commands)
      OSTRSTREAM_CONSTR(oss3, line, 300, std::ios::out);
      reset_ostrstream(oss3); // go to the beginning
      placeholder_char = find_placeholder_char(cmd, Am_VALUE);
      if (placeholder_char)
        oss3 << placeholder_char << ":";
      oss3 << " = ";
      part_chain.Make_Empty();
      gen_script_list_or_value(line, oss3, Am_Script_Line_Value, group, cmd,
                               new_value, false, group, part_chain);
    } // end new_value exists
  }
  if (cmd.Is_Instance_Of(Am_Object_Create_Command) ||
      cmd.Is_Instance_Of(Am_Find_Command)) {
    gen_create_parameters_line(cmd, line, group);
  }
  return group;
}